

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * join_lines(string *__return_storage_ptr__,
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *lines)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  reference local_40;
  string *line;
  iterator __end1;
  iterator __begin1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(lines);
  line = (string *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(lines);
  while (bVar1 = std::operator==(&__end1,(_Self *)&line), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_40 = std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    std::operator+(&local_60,local_40,"\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

string join_lines(list<string> & lines){
    string str;
    for(string& line: lines){
        str += line + "\n";
    }
    return str;
}